

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_kvs_info_create(fdb_kvs_handle *root_handle,fdb_kvs_handle *handle,filemgr *file,
                        char *kvs_name)

{
  void *pvVar1;
  avl_node *paVar2;
  long *plVar3;
  avl_node *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  avl_node *a;
  kvs_opened_node *opened_node;
  kvs_node *kvs_node;
  kvs_node query;
  filemgr *in_stack_fffffffffffffef8;
  fdb_kvs_handle *in_stack_ffffffffffffff00;
  avl_cmp_func *in_stack_ffffffffffffff08;
  avl_tree *in_stack_ffffffffffffff18;
  
  pvVar1 = calloc(1,0x18);
  *(void **)(in_RSI + 0x18) = pvVar1;
  if (in_RDI == 0) {
    _fdb_kvs_init_root(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  else {
    **(undefined1 **)(in_RSI + 0x18) = 1;
    *(long *)(*(long *)(in_RSI + 0x18) + 0x10) = in_RDI;
    if (in_RCX == (avl_node *)0x0) {
      *(undefined8 *)(*(long *)(in_RSI + 0x18) + 8) = 0;
    }
    else {
      pthread_spin_lock((pthread_spinlock_t *)(*(long *)(in_RDX + 0x170) + 0x38));
      paVar2 = avl_search(in_stack_ffffffffffffff18,in_RCX,in_stack_ffffffffffffff08);
      if (paVar2 == (avl_node *)0x0) {
        free(*(void **)(in_RSI + 0x18));
        *(undefined8 *)(in_RSI + 0x18) = 0;
        pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RDX + 0x170) + 0x38));
        return;
      }
      *(avl_node **)(*(long *)(in_RSI + 0x18) + 8) = paVar2[-7].right;
      *(avl_node **)(in_RSI + 8) = paVar2[-6].right;
      *(avl_node **)(in_RSI + 0x10) = paVar2[-5].parent;
      pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RDX + 0x170) + 0x38));
    }
    plVar3 = (long *)calloc(1,0x18);
    *plVar3 = in_RSI;
    *(long **)(in_RSI + 0x1d8) = plVar3;
    pthread_spin_lock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x28) + 0x20));
    list_push_back(*(list **)(*(long *)(in_RDI + 0x28) + 8),(list_elem *)(plVar3 + 1));
    pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(in_RDI + 0x28) + 0x20));
  }
  return;
}

Assistant:

void fdb_kvs_info_create(fdb_kvs_handle *root_handle,
                         fdb_kvs_handle *handle,
                         struct filemgr *file,
                         const char *kvs_name)
{
    struct kvs_node query, *kvs_node;
    struct kvs_opened_node *opened_node;
    struct avl_node *a;

    handle->kvs = (struct kvs_info*)calloc(1, sizeof(struct kvs_info));

    if (root_handle == NULL) {
        // 'handle' is a super handle
        _fdb_kvs_init_root(handle, file);
    } else {
        // 'handle' is a sub handle (i.e., KV instance in a DB instance)
        handle->kvs->type = KVS_SUB;
        handle->kvs->root = root_handle;

        if (kvs_name) {
            spin_lock(&file->kv_header->lock);
            query.kvs_name = (char*)kvs_name;
            a = avl_search(file->kv_header->idx_name, &query.avl_name,
                           _kvs_cmp_name);
            if (a == NULL) {
                // KV instance name is not found
                free(handle->kvs);
                handle->kvs = NULL;
                spin_unlock(&file->kv_header->lock);
                return;
            }
            kvs_node = _get_entry(a, struct kvs_node, avl_name);
            handle->kvs->id = kvs_node->id;
            // force custom cmp function
            handle->kvs_config.custom_cmp = kvs_node->custom_cmp;
            handle->kvs_config.custom_cmp_param = kvs_node->user_param;
            spin_unlock(&file->kv_header->lock);
        } else {
            // snapshot of the root handle
            handle->kvs->id = 0;
        }

        opened_node = (struct kvs_opened_node *)
               calloc(1, sizeof(struct kvs_opened_node));
        opened_node->handle = handle;

        handle->node = opened_node;
        spin_lock(&root_handle->fhandle->lock);
        list_push_back(root_handle->fhandle->handles, &opened_node->le);
        spin_unlock(&root_handle->fhandle->lock);
    }
}